

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_fn.c
# Opt level: O3

ObjFn * newObjFn(VM *vm,ObjModule *objModule,uint32_t slotNum)

{
  ObjFn *objHeader;
  
  objHeader = (ObjFn *)memManager(vm,(void *)0x0,0,0x50);
  if (objHeader == (ObjFn *)0x0) {
    errorReport((void *)0x0,ERROR_MEM,"Failed to allocate ObjFn!");
  }
  initObjHeader(vm,(ObjHeader *)objHeader,OT_FUNCTION,vm->fnClass);
  ByteBufferInit(&objHeader->instrStream);
  ValueBufferInit(&objHeader->constants);
  objHeader->module = objModule;
  objHeader->maxStackSlotUsedNum = slotNum;
  objHeader->argNum = '\0';
  objHeader->upvalueNum = 0;
  return objHeader;
}

Assistant:

ObjFn* newObjFn(VM* vm, ObjModule* objModule, uint32_t slotNum) {
    ObjFn* objFn = ALLOCATE(vm, ObjFn);
    if (objFn == NULL) {
        MEM_ERROR("Failed to allocate ObjFn!");
    }
    initObjHeader(vm, &objFn->objHeader, OT_FUNCTION, vm->fnClass);
    ByteBufferInit(&objFn->instrStream);
    ValueBufferInit(&objFn->constants);
    objFn->module = objModule;
    objFn->maxStackSlotUsedNum = slotNum;
    objFn->upvalueNum = objFn->argNum = 0;
#ifdef DEBUG
    objFn->debug = ALLOCATE(vm, FnDebug);
    objFn->debug->fnName = NULL;
    IntBufferInit(&objFn->debug->lineNo);
#endif
    return objFn;
}